

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O3

int __thiscall IPAsirMiniSAT::val(IPAsirMiniSAT *this,int lit)

{
  Lit LVar1;
  int iVar2;
  
  iVar2 = 0;
  if (this->nomodel == false) {
    LVar1 = import(this,lit);
    iVar2 = -lit;
    if ((this->super_SimpSolver).super_Solver.model.data[LVar1.x >> 1].value == ((byte)LVar1.x & 1))
    {
      iVar2 = lit;
    }
  }
  return iVar2;
}

Assistant:

int val(int lit)
    {
        if (nomodel) return 0;
        lbool res = modelValue(import(lit));
        return (res == l_True) ? lit : -lit;
    }